

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal.cpp
# Opt level: O2

int PAL_InitializeChakraCore(void)

{
  Volatile<int> VVar1;
  int iVar2;
  uint uVar3;
  PAL_ERROR PVar4;
  DWORD DVar5;
  BOOL BVar6;
  CSharedMemoryObjectManager *this;
  int iVar7;
  undefined8 uVar8;
  int iVar9;
  PAL_ERROR dwErrCode;
  char *pcVar10;
  bool bVar11;
  rlimit64 local_48;
  CPalThread *local_38;
  CPalThread *pThread;
  
  iVar9 = 0;
  if (0 < init_count.m_val) {
    return 0;
  }
  PAL_InitializeChakraCoreCalled = true;
  local_38 = (CPalThread *)0x0;
  dwErrCode = 0x1f;
  SetLastError(0x1f);
  iVar2 = getrlimit64(RLIMIT_STACK,&local_48);
  if ((iVar2 == 0) && (0x800000 < local_48.rlim_cur)) {
    local_48.rlim_cur = 0x800000;
    iVar2 = setrlimit64(RLIMIT_STACK,&local_48);
    if (iVar2 != 0) {
      pcVar10 = 
      "err == 0 && \"Well, the environment has a strange stack limit               and setrlimit call failed to fix that\""
      ;
      uVar8 = 0x97;
      goto LAB_0012a2f6;
    }
  }
  CorUnix::CriticalSectionSubSysInitialize();
  if (init_critsec == (PCRITICAL_SECTION)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&init_critsec_mutex);
    if (init_critsec == (PCRITICAL_SECTION)0x0) {
      CorUnix::InternalInitializeCriticalSectionAndSpinCount
                ((PCRITICAL_SECTION)Initialize()::temp_critsec,0,false);
      LOCK();
      bVar11 = init_critsec == (PCRITICAL_SECTION)0x0;
      if (bVar11) {
        init_critsec = (PCRITICAL_SECTION)Initialize()::temp_critsec;
      }
      UNLOCK();
      if (!bVar11) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012a198;
        InternalDeleteCriticalSection((PCRITICAL_SECTION)Initialize()::temp_critsec);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&init_critsec_mutex);
  }
  CorUnix::InternalEnterCriticalSection(local_38,init_critsec);
  VVar1 = init_count;
  if (init_count.m_val == 0) {
    gPID = getpid();
    BVar6 = TLSInitialize();
    if (((BVar6 != 0) && (BVar6 = MiscInitialize(), BVar6 != 0)) &&
       (BVar6 = DBG_init_channels(), BVar6 != 0)) {
      uVar3 = getpagesize();
      if (uVar3 != 0x1000) {
        fprintf(_stderr,"] %s %s:%d","Initialize",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/init/pal.cpp"
                ,0xd6);
        fprintf(_stderr,
                "VIRTUAL_PAGE_SIZE is incorrect for this system!\nChange include/pal/virtual.h and clr/src/inc/stdmacros.h to reflect the correct page size of %d.\n"
                ,(ulong)uVar3);
      }
      BVar6 = SHMInitialize();
      if (BVar6 != 0) {
        PVar4 = CorUnix::InitializeProcessData();
        if ((PVar4 == 0) && (PVar4 = CorUnix::CreateThreadData(&local_38), PVar4 == 0)) {
          CorUnix::PROCAddThread(local_38,local_38);
          g_fThreadDataAvailable = 1;
          BVar6 = LOADInitializeModules();
          if (BVar6 != 0) {
            this = CorUnix::InternalNew<CorUnix::CSharedMemoryObjectManager>();
            if (this == (CSharedMemoryObjectManager *)0x0) {
              if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012a198;
              dwErrCode = 0xe;
            }
            else {
              PVar4 = CorUnix::CSharedMemoryObjectManager::Initialize(this);
              if (PVar4 == 0) {
                CorUnix::g_pObjectManager = this;
                CorUnix::g_pSynchronizationManager =
                     CorUnix::CPalSynchMgrController::CreatePalSynchronizationManager();
                if (CorUnix::g_pSynchronizationManager != (IPalSynchronizationManager *)0x0)
                goto LAB_00129ee4;
                if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012a198;
                dwErrCode = 8;
              }
              else {
                if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012a198;
                CorUnix::InternalDelete<CorUnix::CSharedMemoryObjectManager>(this);
                dwErrCode = PVar4;
              }
            }
            goto LAB_0012a027;
          }
          PVar4 = 0x54f;
        }
        dwErrCode = PVar4;
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012a198;
        goto LAB_0012a027;
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012a198;
      goto LAB_0012a030;
    }
    bVar11 = false;
  }
  else {
    local_38 = CorUnix::InternalGetCurrentThread();
LAB_00129ee4:
    if (init_count.m_val == 0) {
      PVar4 = CorUnix::CreateInitialProcessAndThreadObjects(local_38);
      if (PVar4 == 0) {
        BVar6 = SEHInitializeSignals();
        if (BVar6 == 0) {
          dwErrCode = 0;
        }
        else {
          BVar6 = TIMEInitialize();
          PVar4 = dwErrCode;
          if ((BVar6 == 0) || (BVar6 = MAPInitialize(), BVar6 == 0)) goto joined_r0x0012a192;
          BVar6 = FILEInitStdHandles();
          if (BVar6 == 0) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012a198;
          }
          else {
            BVar6 = CRTInitStdStreams();
            if (BVar6 != 0) {
              if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012a198;
              init_count.m_val = init_count.m_val + 1;
              goto LAB_00129f1b;
            }
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012a198;
            FILECleanupStdHandles();
          }
          VIRTUALCleanup();
          MAPCleanup();
        }
      }
      else {
joined_r0x0012a192:
        dwErrCode = PVar4;
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012a198;
      }
      PROCCleanupInitialProcess();
LAB_0012a027:
      SHMCleanup();
LAB_0012a030:
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) goto LAB_0012a198;
      bVar11 = false;
    }
    else {
      init_count.m_val = init_count.m_val + 1;
      PAL_Enter(PAL_BoundaryTop);
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012a198;
LAB_00129f1b:
      dwErrCode = 0;
      bVar11 = true;
    }
    SetLastError(dwErrCode);
  }
  CorUnix::InternalLeaveCriticalSection(local_38,init_critsec);
  if (((bVar11) && (VVar1.m_val == 0)) && (local_38 == (CPalThread *)0x0)) {
    pcVar10 = "__null != pThread";
    uVar8 = 0x1a7;
LAB_0012a2f6:
    fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/init/pal.cpp"
            ,uVar8,pcVar10,"");
    fflush(_stderr);
    abort();
  }
  if (bVar11) {
    if (PAL_InitializeChakraCoreCalled == true) {
      BVar6 = VIRTUALInitialize();
      if (BVar6 == 0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012a198;
        iVar9 = 0x1f;
      }
      else {
        LOCK();
        iVar2 = g_chakraCoreInitialized.m_val + 1;
        UNLOCK();
        iVar7 = g_chakraCoreInitialized.m_val + 1;
        g_chakraCoreInitialized.m_val = iVar2;
        if (1 < iVar7) {
          iVar9 = 0;
          PAL_Enter(PAL_BoundaryTop);
        }
      }
      return iVar9;
    }
  }
  else {
    DVar5 = GetLastError();
    if (DVar5 == 0) {
      fprintf(_stderr,"] %s %s:%d","Initialize",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/init/pal.cpp"
              ,0x1ac);
      fprintf(_stderr,"returning failure, but last error not set\n");
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      DVar5 = GetLastError();
      return DVar5;
    }
  }
LAB_0012a198:
  abort();
}

Assistant:

int
PALAPI
PAL_InitializeChakraCore()
{
    // this is not thread safe but PAL_InitializeChakraCore is per process
    // besides, calling Jsrt initializer function is thread safe
    if (init_count > 0) return ERROR_SUCCESS;
#if defined(ENABLE_CC_XPLAT_TRACE) || defined(DEBUG)
    PAL_InitializeChakraCoreCalled = true;
#endif

    if (Initialize())
    {
        return GetLastError();
    }

    if (FALSE == VIRTUALInitialize())
    {
        ERROR("Unable to initialize virtual memory support\n");
        return ERROR_GEN_FAILURE;
    }

    // Check for a repeated call (this is a no-op).
    if (InterlockedIncrement(&g_chakraCoreInitialized) > 1)
    {
        PAL_Enter(PAL_BoundaryTop);
        return ERROR_SUCCESS;
    }

    return ERROR_SUCCESS;
}